

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::TextFlow::Columns::iterator::iterator(void *param_1,undefined8 param_2)

{
  bool bVar1;
  Column *col;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_> *__range2;
  value_type *in_stack_ffffffffffffff58;
  Column *in_stack_ffffffffffffff60;
  size_type in_stack_ffffffffffffff88;
  vector<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
  *in_stack_ffffffffffffff90;
  __normal_iterator<const_Catch::TextFlow::Column_*,_std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>_>
  local_38;
  undefined8 local_30;
  undefined8 local_18;
  void *local_10;
  
  *(undefined8 *)param_1 = param_2;
  local_18 = param_2;
  local_10 = param_1;
  std::
  vector<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
  ::vector((vector<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
            *)0x19718d);
  *(undefined8 *)((long)param_1 + 0x20) = 0;
  std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::size(*param_1);
  std::
  vector<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
  ::reserve(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  local_30 = *param_1;
  local_38._M_current =
       (Column *)
       std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::begin
                 ((vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_> *)
                  in_stack_ffffffffffffff58);
  std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::end
            ((vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_> *)
             in_stack_ffffffffffffff58);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::TextFlow::Column_*,_std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>_>
                        *)in_stack_ffffffffffffff60,
                       (__normal_iterator<const_Catch::TextFlow::Column_*,_std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>_>
                        *)in_stack_ffffffffffffff58);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_Catch::TextFlow::Column_*,_std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>_>
    ::operator*(&local_38);
    in_stack_ffffffffffffff60 = (Column *)((long)param_1 + 8);
    Column::end(in_stack_ffffffffffffff60);
    std::
    vector<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
    ::push_back((vector<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
                 *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    __gnu_cxx::
    __normal_iterator<const_Catch::TextFlow::Column_*,_std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>_>
    ::operator++(&local_38);
  }
  return;
}

Assistant:

Columns::iterator::iterator( Columns const& columns, EndTag ):
            m_columns( columns.m_columns ), m_activeIterators( 0 ) {

            m_iterators.reserve( m_columns.size() );
            for ( auto const& col : m_columns ) {
                m_iterators.push_back( col.end() );
            }
        }